

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O0

Aig_Obj_t *
createAndGateForMonotonicityVerification
          (Aig_Man_t *pNewAig,Vec_Ptr_t *vDisjunctionSignals,Vec_Ptr_t *vDisjunctionLo,
          Aig_Obj_t *pendingLo,Aig_Obj_t *pendingSignal)

{
  int iVar1;
  Aig_Obj_t *p0;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  undefined4 local_5c;
  int i;
  Aig_Obj_t *pObjPendingAndPendingLo;
  Aig_Obj_t *pObjImply;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObjBigAnd;
  Aig_Obj_t *pendingSignal_local;
  Aig_Obj_t *pendingLo_local;
  Vec_Ptr_t *vDisjunctionLo_local;
  Vec_Ptr_t *vDisjunctionSignals_local;
  Aig_Man_t *pNewAig_local;
  
  pObj = Aig_ManConst1(pNewAig);
  p0 = Aig_And(pNewAig,pendingLo,pendingSignal);
  for (local_5c = 0; iVar1 = Vec_PtrSize(vDisjunctionSignals), local_5c < iVar1;
      local_5c = local_5c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vDisjunctionSignals,local_5c);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vDisjunctionLo,local_5c);
    pAVar3 = Aig_And(pNewAig,p0,pAVar3);
    pAVar3 = Aig_Not(pAVar3);
    pAVar2 = Aig_Or(pNewAig,pAVar3,pAVar2);
    pObj = Aig_And(pNewAig,pObj,pAVar2);
  }
  return pObj;
}

Assistant:

Aig_Obj_t *createAndGateForMonotonicityVerification(
				Aig_Man_t *pNewAig,
				Vec_Ptr_t *vDisjunctionSignals,
				Vec_Ptr_t *vDisjunctionLo,
				Aig_Obj_t *pendingLo,
				Aig_Obj_t *pendingSignal
				)
{
	Aig_Obj_t *pObjBigAnd, *pObj, *pObjLo, *pObjImply;
	Aig_Obj_t *pObjPendingAndPendingLo;
	int i;

	pObjBigAnd = Aig_ManConst1( pNewAig );
	pObjPendingAndPendingLo = Aig_And( pNewAig, pendingLo, pendingSignal );
	Vec_PtrForEachEntry( Aig_Obj_t *, vDisjunctionSignals, pObj, i )
	{
		pObjLo = (Aig_Obj_t *)Vec_PtrEntry( vDisjunctionLo, i );	
		pObjImply = Aig_Or( pNewAig, Aig_Not(Aig_And( pNewAig, pObjPendingAndPendingLo, pObjLo)),
					pObj );
		pObjBigAnd = Aig_And( pNewAig, pObjBigAnd, pObjImply );
	}
	return pObjBigAnd;
}